

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O2

bool __thiscall
cmNewLineStyle::ReadFromArguments
          (cmNewLineStyle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errorString)

{
  pointer pbVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  byte unaff_BL;
  ulong uVar6;
  long lVar7;
  Style SVar8;
  string eol;
  
  this->NewLineStyle = Invalid;
  uVar2 = 0;
  lVar3 = 0;
  do {
    lVar7 = lVar3;
    uVar5 = uVar2;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    if (uVar6 <= uVar5) goto LAB_00296f3a;
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar7),"NEWLINE_STYLE");
    uVar2 = uVar5 + 1;
    lVar3 = lVar7 + 0x20;
  } while (!bVar4);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5 + 1) {
    std::__cxx11::string::assign((char *)errorString);
    unaff_BL = 0;
    goto LAB_00296f3a;
  }
  std::__cxx11::string::string((string *)&eol,(string *)((long)&pbVar1[1]._M_dataplus._M_p + lVar7))
  ;
  bVar4 = std::operator==(&eol,"LF");
  SVar8 = LF;
  if (bVar4) {
LAB_00296f11:
    this->NewLineStyle = SVar8;
    unaff_BL = 1;
  }
  else {
    bVar4 = std::operator==(&eol,"UNIX");
    if (bVar4) goto LAB_00296f11;
    bVar4 = std::operator==(&eol,"CRLF");
    SVar8 = CRLF;
    if (bVar4) goto LAB_00296f11;
    bVar4 = std::operator==(&eol,"WIN32");
    if (bVar4) goto LAB_00296f11;
    bVar4 = std::operator==(&eol,"DOS");
    if (bVar4) goto LAB_00296f11;
    std::__cxx11::string::assign((char *)errorString);
    unaff_BL = 0;
  }
  std::__cxx11::string::~string((string *)&eol);
LAB_00296f3a:
  return (bool)(uVar6 <= uVar5 | unaff_BL & 1);
}

Assistant:

bool cmNewLineStyle::ReadFromArguments(const std::vector<std::string>& args,
                                       std::string& errorString)
{
  NewLineStyle = Invalid;

  for (size_t i = 0; i< args.size(); i++)
    {
    if (args[i] == "NEWLINE_STYLE")
      {
      size_t const styleIndex = i + 1;
      if (args.size() > styleIndex)
        {
        const std::string eol = args[styleIndex];
        if (eol == "LF" || eol == "UNIX")
          {
          NewLineStyle = LF;
          return true;
          }
        else if (eol == "CRLF" || eol == "WIN32" || eol == "DOS")
          {
          NewLineStyle = CRLF;
          return true;
          }
        else
          {
          errorString = "NEWLINE_STYLE sets an unknown style, only LF, "
                        "CRLF, UNIX, DOS, and WIN32 are supported";
          return false;
          }
        }
      else
        {
        errorString = "NEWLINE_STYLE must set a style: "
                      "LF, CRLF, UNIX, DOS, or WIN32";
        return false;
        }
      }
    }
  return true;
}